

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int PatchText(int oldSize)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined3 uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined3 uVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  DehSpriteMap *__s1;
  DehSpriteMap *pDVar21;
  char *newStr;
  char *oldStr;
  
  pcVar18 = Line2 + -1;
  do {
    cVar12 = pcVar18[1];
    pcVar18 = pcVar18 + 1;
  } while (' ' < cVar12);
  while ((cVar12 != '\0' && (cVar12 < '!'))) {
    pcVar14 = pcVar18 + 1;
    pcVar18 = pcVar18 + 1;
    cVar12 = *pcVar14;
  }
  if (cVar12 == '\0') {
    Printf("Text chunk is missing size of new string.\n");
    iVar13 = 2;
  }
  else {
    iVar13 = atoi(pcVar18);
    pcVar18 = (char *)operator_new__((long)(oldSize + 1));
    oldStr = pcVar18;
    pcVar14 = (char *)operator_new__((long)(iVar13 + 1));
    newStr = pcVar14;
    ReadChars(&oldStr,oldSize);
    ReadChars(&newStr,iVar13);
    if (includenotext == '\x01') {
      Printf("Skipping text chunk in included patch.\n");
    }
    else {
      DPrintf(4,"Searching for text:\n%s\n",pcVar18);
      if ((oldSize == 4) && (iVar13 = FindSprite(pcVar18), iVar13 != -1)) {
        strncpy((char *)(sprites.Array + iVar13),pcVar14,4);
        iVar13 = strncmp("PLAY",pcVar18,4);
        if (iVar13 == 0) {
          strncpy(deh.PlayerSprite,pcVar14,4);
        }
        lVar19 = 0;
        uVar17 = OrgSprNames.Count;
        for (uVar20 = 0; uVar20 < uVar17; uVar20 = uVar20 + 1) {
          pcVar15 = (OrgSprNames.Array)->c;
          iVar13 = strcasecmp(pcVar15 + lVar19,pcVar18);
          if (iVar13 == 0) {
            strcpy(pcVar15 + lVar19,pcVar14);
            uVar17 = OrgSprNames.Count;
          }
          lVar19 = lVar19 + 5;
        }
        __s1 = DehSpriteMappings;
        uVar20 = 0;
LAB_0043425b:
        if (uVar20 != 0x24) {
          iVar13 = strncmp(__s1->Sprite,pcVar18,4);
          if (iVar13 != 0) goto code_r0x00434273;
          strncpy(__s1->Sprite,pcVar14,4);
          while( true ) {
            pDVar21 = __s1 + -1;
            if ((uVar20 == 0) || (iVar13 = strncmp(pDVar21->Sprite,pcVar14,4), iVar13 < 1)) break;
            cVar6 = pDVar21->Sprite[0];
            cVar7 = pDVar21->Sprite[1];
            cVar8 = pDVar21->Sprite[2];
            cVar9 = pDVar21->Sprite[3];
            cVar10 = pDVar21->Sprite[4];
            uVar11 = *(undefined3 *)&pDVar21->field_0x5;
            pcVar15 = __s1[-1].ClassName;
            cVar12 = __s1->Sprite[1];
            cVar2 = __s1->Sprite[2];
            cVar3 = __s1->Sprite[3];
            cVar4 = __s1->Sprite[4];
            uVar5 = *(undefined3 *)&__s1->field_0x5;
            pcVar1 = __s1->ClassName;
            pDVar21->Sprite[0] = __s1->Sprite[0];
            pDVar21->Sprite[1] = cVar12;
            pDVar21->Sprite[2] = cVar2;
            pDVar21->Sprite[3] = cVar3;
            pDVar21->Sprite[4] = cVar4;
            *(undefined3 *)&pDVar21->field_0x5 = uVar5;
            __s1[-1].ClassName = pcVar1;
            __s1->Sprite[0] = cVar6;
            __s1->Sprite[1] = cVar7;
            __s1->Sprite[2] = cVar8;
            __s1->Sprite[3] = cVar9;
            __s1->Sprite[4] = cVar10;
            *(undefined3 *)&__s1->field_0x5 = uVar11;
            __s1->ClassName = pcVar15;
            uVar20 = uVar20 - 1;
            __s1 = pDVar21;
          }
          while ((pDVar21 = __s1 + 1, uVar20 < 0x23 &&
                 (iVar13 = strncmp(pDVar21->Sprite,pcVar14,4), iVar13 < 0))) {
            cVar6 = pDVar21->Sprite[0];
            cVar7 = pDVar21->Sprite[1];
            cVar8 = pDVar21->Sprite[2];
            cVar9 = pDVar21->Sprite[3];
            cVar10 = pDVar21->Sprite[4];
            uVar11 = *(undefined3 *)&pDVar21->field_0x5;
            pcVar15 = __s1[1].ClassName;
            cVar12 = __s1->Sprite[1];
            cVar2 = __s1->Sprite[2];
            cVar3 = __s1->Sprite[3];
            cVar4 = __s1->Sprite[4];
            uVar5 = *(undefined3 *)&__s1->field_0x5;
            pcVar1 = __s1->ClassName;
            pDVar21->Sprite[0] = __s1->Sprite[0];
            pDVar21->Sprite[1] = cVar12;
            pDVar21->Sprite[2] = cVar2;
            pDVar21->Sprite[3] = cVar3;
            pDVar21->Sprite[4] = cVar4;
            *(undefined3 *)&pDVar21->field_0x5 = uVar5;
            __s1[1].ClassName = pcVar1;
            __s1->Sprite[0] = cVar6;
            __s1->Sprite[1] = cVar7;
            __s1->Sprite[2] = cVar8;
            __s1->Sprite[3] = cVar9;
            __s1->Sprite[4] = cVar10;
            *(undefined3 *)&__s1->field_0x5 = uVar11;
            __s1->ClassName = pcVar15;
            uVar20 = uVar20 + 1;
            __s1 = pDVar21;
          }
        }
        goto LAB_00434224;
      }
      bVar16 = true;
      while (pcVar15 = FStringTable::MatchString(EnglishStrings,pcVar18), pcVar15 != (char *)0x0) {
        FStringTable::SetString(&GStrings,pcVar15,pcVar14);
        FStringTable::SetString(EnglishStrings,pcVar15,"~~");
        bVar16 = false;
      }
      if (bVar16) {
        DPrintf(4,"   (Unmatched)\n");
      }
    }
LAB_00434224:
    operator_delete__(pcVar14);
    operator_delete__(pcVar18);
    do {
      iVar13 = GetLine();
    } while (iVar13 == 1);
  }
  return iVar13;
code_r0x00434273:
  uVar20 = uVar20 + 1;
  __s1 = __s1 + 1;
  goto LAB_0043425b;
}

Assistant:

static int PatchText (int oldSize)
{
	int newSize;
	char *oldStr;
	char *newStr;
	char *temp;
	INTBOOL good;
	int result;
	int i;

	// Skip old size, since we already know it
	temp = Line2;
	while (*temp > ' ')
		temp++;
	while (*temp && *temp <= ' ')
		temp++;

	if (*temp == 0)
	{
		Printf ("Text chunk is missing size of new string.\n");
		return 2;
	}
	newSize = atoi (temp);

	oldStr = new char[oldSize + 1];
	newStr = new char[newSize + 1];

	if (!oldStr || !newStr)
	{
		Printf ("Out of memory.\n");
		goto donewithtext;
	}

	good = ReadChars (&oldStr, oldSize);
	good += ReadChars (&newStr, newSize);

	if (!good)
	{
		delete[] newStr;
		delete[] oldStr;
		Printf ("Unexpected end-of-file.\n");
		return 0;
	}

	if (includenotext)
	{
		Printf ("Skipping text chunk in included patch.\n");
		goto donewithtext;
	}

	DPrintf (DMSG_SPAMMY, "Searching for text:\n%s\n", oldStr);
	good = false;

	// Search through sprite names; they are always 4 chars
	if (oldSize == 4)
	{
		i = FindSprite (oldStr);
		if (i != -1)
		{
			strncpy (sprites[i].name, newStr, 4);
			if (strncmp ("PLAY", oldStr, 4) == 0)
			{
				strncpy (deh.PlayerSprite, newStr, 4);
			}
			for (unsigned ii = 0; ii < OrgSprNames.Size(); ii++)
			{
				if (!stricmp(OrgSprNames[ii].c, oldStr))
				{
					strcpy(OrgSprNames[ii].c, newStr);
				}
			}
			// If this sprite is used by a pickup, then the DehackedPickup sprite map
			// needs to be updated too.
			for (i = 0; (size_t)i < countof(DehSpriteMappings); ++i)
			{
				if (strncmp (DehSpriteMappings[i].Sprite, oldStr, 4) == 0)
				{
					// Found a match, so change it.
					strncpy (DehSpriteMappings[i].Sprite, newStr, 4);

					// Now shift the map's entries around so that it stays sorted.
					// This must be done because the map is scanned using a binary search.
					while (i > 0 && strncmp (DehSpriteMappings[i-1].Sprite, newStr, 4) > 0)
					{
						swapvalues (DehSpriteMappings[i-1], DehSpriteMappings[i]);
						--i;
					}
					while ((size_t)i < countof(DehSpriteMappings)-1 &&
						strncmp (DehSpriteMappings[i+1].Sprite, newStr, 4) < 0)
					{
						swapvalues (DehSpriteMappings[i+1], DehSpriteMappings[i]);
						++i;
					}
					break;
				}
			}
			goto donewithtext;
		}
	}

	// Search through most other texts
	const char *str;
	do
	{
		str = EnglishStrings->MatchString(oldStr);
		if (str != NULL)
		{
			GStrings.SetString(str, newStr);
			EnglishStrings->SetString(str, "~~");	// set to something invalid so that it won't get found again by the next iteration or  by another replacement later
			good = true;
		}
	} 
	while (str != NULL);	// repeat search until the text can no longer be found

	if (!good)
	{
		DPrintf (DMSG_SPAMMY, "   (Unmatched)\n");
	}
		
donewithtext:
	if (newStr)
		delete[] newStr;
	if (oldStr)
		delete[] oldStr;

	// Fetch next identifier for main loop
	while ((result = GetLine ()) == 1)
		;

	return result;
}